

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O1

uint16_t __thiscall
VmaBlockMetadata_TLSF::SizeToSecondIndex
          (VmaBlockMetadata_TLSF *this,VkDeviceSize size,uint8_t memoryClass)

{
  undefined3 in_register_00000011;
  
  if (CONCAT31(in_register_00000011,memoryClass) != 0) {
    return (ushort)(size >> (memoryClass + 2 & 0x3f)) ^ 0x20;
  }
  if ((this->super_VmaBlockMetadata).m_IsVirtual == true) {
    return (uint16_t)((int)size - 1U >> 3);
  }
  return (uint16_t)((int)size - 1U >> 6);
}

Assistant:

uint16_t VmaBlockMetadata_TLSF::SizeToSecondIndex(VkDeviceSize size, uint8_t memoryClass) const
{
    if (memoryClass == 0)
    {
        if (IsVirtual())
            return static_cast<uint16_t>((size - 1) / 8);
        else
            return static_cast<uint16_t>((size - 1) / 64);
    }
    return static_cast<uint16_t>((size >> (memoryClass + MEMORY_CLASS_SHIFT - SECOND_LEVEL_INDEX)) ^ (1U << SECOND_LEVEL_INDEX));
}